

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O3

void __thiscall rw::Texture::destroy(Texture *this)

{
  int iVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  
  iVar1 = this->refCount;
  this->refCount = iVar1 + -1;
  if (iVar1 < 2) {
    PluginList::destruct((PluginList *)&s_plglist,this);
    if (this->dict != (TexDictionary *)0x0) {
      pLVar2 = (this->inDict).next;
      pLVar3 = (this->inDict).prev;
      pLVar3->next = pLVar2;
      pLVar2->prev = pLVar3;
    }
    if (this->raster != (Raster *)0x0) {
      Raster::destroy(this->raster);
    }
    pLVar2 = (this->inGlobalList).next;
    pLVar3 = (this->inGlobalList).prev;
    pLVar3->next = pLVar2;
    pLVar2->prev = pLVar3;
    (*DAT_0014ada0)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Texture::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		if(this->dict)
			this->inDict.remove();
		if(this->raster)
			this->raster->destroy();
		this->inGlobalList.remove();
		rwFree(this);
		numAllocated--;
	}
}